

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  float fVar1;
  char *pcVar2;
  byte bVar3;
  ImGuiContext *pIVar4;
  ImGuiTableSettings *pIVar5;
  long lVar6;
  ImGuiTableColumn *pIVar7;
  ImGuiTableSettings *pIVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  ImGuiContext *g;
  bool bVar12;
  float fVar13;
  
  table->IsSettingsDirty = false;
  pIVar4 = GImGui;
  if ((table->Flags & 0x10) != 0) {
    return;
  }
  lVar6 = (long)table->SettingsOffset;
  if (lVar6 != -1) {
    pcVar2 = (GImGui->SettingsTables).Buf.Data;
    pIVar5 = (ImGuiTableSettings *)(pcVar2 + lVar6);
    iVar9 = table->ColumnsCount;
    if (iVar9 <= pcVar2[lVar6 + 0xd]) goto LAB_00232aeb;
    pIVar5->ID = 0;
  }
  pIVar5 = TableSettingsCreate(table->ID,table->ColumnsCount);
  table->SettingsOffset = (int)pIVar5 - *(int *)&(pIVar4->SettingsTables).Buf.Data;
  iVar9 = table->ColumnsCount;
LAB_00232aeb:
  pIVar5->ColumnsCount = (ImGuiTableColumnIdx)iVar9;
  pIVar7 = (table->Columns).Data;
  pIVar5->SaveFlags = 0;
  fVar13 = 0.0;
  if (0 < table->ColumnsCount) {
    pIVar8 = pIVar5 + 1;
    iVar9 = 0;
    bVar11 = 0;
    do {
      bVar3 = bVar11;
      fVar1 = *(float *)((long)&pIVar7->WidthRequest + (ulong)(pIVar7->Flags & 8));
      pIVar8->ID = (ImGuiID)fVar1;
      *(char *)&pIVar8->RefScale = (char)iVar9;
      *(ImGuiTableColumnIdx *)((long)&pIVar8->RefScale + 1) = pIVar7->DisplayOrder;
      *(ImGuiTableColumnIdx *)((long)&pIVar8->RefScale + 2) = pIVar7->SortOrder;
      bVar10 = pIVar7->field_0x65 & 3;
      bVar11 = *(byte *)((long)&pIVar8->RefScale + 3);
      *(byte *)((long)&pIVar8->RefScale + 3) = bVar11 & 0xfc | bVar10;
      bVar11 = bVar11 & 0xf8 | bVar10 | pIVar7->IsUserEnabled << 2;
      *(byte *)((long)&pIVar8->RefScale + 3) = bVar11;
      *(byte *)((long)&pIVar8->RefScale + 3) = bVar11 & 0xf7 | (byte)pIVar7->Flags & 8;
      bVar12 = (pIVar7->Flags & 8) == 0;
      if ((fVar1 != pIVar7->InitStretchWeightOrWidth) ||
         (NAN(fVar1) || NAN(pIVar7->InitStretchWeightOrWidth))) {
        *(byte *)&pIVar5->SaveFlags = (byte)pIVar5->SaveFlags | 1;
      }
      if (iVar9 != pIVar7->DisplayOrder) {
        *(byte *)&pIVar5->SaveFlags = (byte)pIVar5->SaveFlags | 2;
      }
      if (pIVar7->SortOrder != -1) {
        *(byte *)&pIVar5->SaveFlags = (byte)pIVar5->SaveFlags | 8;
      }
      if (((uint)pIVar7->Flags >> 1 & 1) == (uint)pIVar7->IsUserEnabled) {
        *(byte *)&pIVar5->SaveFlags = (byte)pIVar5->SaveFlags | 4;
      }
      iVar9 = iVar9 + 1;
      pIVar7 = pIVar7 + 1;
      pIVar8 = (ImGuiTableSettings *)&pIVar8->ColumnsCount;
      bVar11 = bVar3 | bVar12;
    } while (iVar9 < table->ColumnsCount);
    pIVar5->SaveFlags = pIVar5->SaveFlags & table->Flags;
    if ((bool)(bVar3 | bVar12)) {
      fVar13 = table->RefScale;
    }
  }
  pIVar5->RefScale = fVar13;
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}